

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMAddress.hpp
# Opt level: O3

ImageAddress __thiscall HiROMAddress::toImageAddress(HiROMAddress *this)

{
  uint uVar1;
  uint uVar2;
  long in_RSI;
  
  uVar1 = *(uint *)(in_RSI + 8);
  uVar2 = 0xffffffff;
  if ((char)(uVar1 >> 0x10) < '~') {
    if ((uVar1 & 0x408000) == 0) {
      __assert_fail("bankAddress() > 0x7FFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/ROMAddress.cpp"
                    ,0x9a,"virtual ImageAddress HiROMAddress::toImageAddress() const");
    }
    uVar2 = uVar1 & 0x3fffff;
  }
  *(uint *)&(this->super_ROMAddress)._vptr_ROMAddress = uVar2;
  return (ImageAddress)(uint32_t)this;
}

Assistant:

uint8_t bank() const { return (m_Address & 0xFF0000) >> 16; }